

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.hpp
# Opt level: O2

TestInstance * __thiscall
vkt::texture::util::
TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMaxLevelTestInstance>::createInstance
          (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMaxLevelTestInstance> *this
          ,Context *context)

{
  Texture3DLodControlTestInstance *this_00;
  
  this_00 = (Texture3DLodControlTestInstance *)operator_new(800);
  texture::anon_unknown_0::Texture3DLodControlTestInstance::Texture3DLodControlTestInstance
            (this_00,context,&this->m_testsParameters);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__Texture3DMaxLevelTestInstance_00c0c578;
  texture::anon_unknown_0::Texture3DMipmapTestCaseParameters::Texture3DMipmapTestCaseParameters
            ((Texture3DMipmapTestCaseParameters *)(this_00 + 1),&this->m_testsParameters);
  return &this_00->super_TestInstance;
}

Assistant:

virtual TestInstance*				createInstance				(Context& context) const
										{
											return new INSTANCE_TYPE(context, m_testsParameters);
										}